

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::unapplyScale(HighsSparseMatrix *this,HighsScale *scale)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->format_ == kColwise) {
    uVar8 = 0;
    uVar7 = (ulong)(uint)this->num_col_;
    if (this->num_col_ < 1) {
      uVar7 = uVar8;
    }
    while (uVar9 = uVar8, uVar9 != uVar7) {
      iVar1 = piVar2[uVar9 + 1];
      piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)piVar2[uVar9]; uVar8 = uVar9 + 1, lVar10 < iVar1; lVar10 = lVar10 + 1) {
        pdVar4[lVar10] = pdVar4[lVar10] / (pdVar5[uVar9] * pdVar6[piVar3[lVar10]]);
      }
    }
  }
  else {
    uVar8 = 0;
    uVar7 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar7 = uVar8;
    }
    while (uVar9 = uVar8, uVar9 != uVar7) {
      iVar1 = piVar2[uVar9 + 1];
      piVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)piVar2[uVar9]; uVar8 = uVar9 + 1, lVar10 < iVar1; lVar10 = lVar10 + 1) {
        pdVar4[lVar10] = pdVar4[lVar10] / (pdVar5[piVar3[lVar10]] * pdVar6[uVar9]);
      }
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}